

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

int duckdb_fmt::v6::internal::format_float<double>
              (char *buf,size_t size,char *format,int precision,double value)

{
  int iVar1;
  
  if (precision < 0) {
    iVar1 = snprintf(buf,size,format);
    return iVar1;
  }
  iVar1 = snprintf(buf,size,format);
  return iVar1;
}

Assistant:

int format_float(char* buf, std::size_t size, const char* format, int precision,
                 T value) {
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  if (precision > 100000)
    throw std::runtime_error(
        "fuzz mode - avoid large allocation inside snprintf");
#endif
  // Suppress the warning about nonliteral format string.
  auto snprintf_ptr = FMT_SNPRINTF;
  return precision < 0 ? snprintf_ptr(buf, size, format, value)
                       : snprintf_ptr(buf, size, format, precision, value);
}